

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::cleanUp(void)

{
  long *plVar1;
  undefined8 *puVar2;
  
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (long *)0x0) {
    plVar1 = (long *)operator_new(0xd0);
    *plVar1 = (long)&PTR__RegistryHub_001b01d0;
    plVar1[1] = (long)&PTR__RegistryHub_001b0228;
    TestRegistry::TestRegistry((TestRegistry *)(plVar1 + 2));
    plVar1[0xc] = (long)&PTR__ReporterRegistry_001b0500;
    *(undefined4 *)(plVar1 + 0xe) = 0;
    plVar1[0xf] = 0;
    plVar1[0x10] = (long)(plVar1 + 0xe);
    plVar1[0x11] = (long)(plVar1 + 0xe);
    plVar1[0x12] = 0;
    plVar1[0x13] = 0;
    plVar1[0x14] = 0;
    plVar1[0x15] = 0;
    plVar1[0x16] = (long)&PTR__ExceptionTranslatorRegistry_001b0550;
    plVar1[0x17] = 0;
    plVar1[0x18] = 0;
    plVar1[0x19] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = plVar1;
  }
  (**(code **)(*(anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 8))
            ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub);
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (long *)0x0) {
    puVar2 = (undefined8 *)operator_new(0xd0);
    *puVar2 = &PTR__RegistryHub_001b01d0;
    puVar2[1] = &PTR__RegistryHub_001b0228;
    TestRegistry::TestRegistry((TestRegistry *)(puVar2 + 2));
    puVar2[0xc] = &PTR__ReporterRegistry_001b0500;
    *(undefined4 *)(puVar2 + 0xe) = 0;
    puVar2[0xf] = 0;
    puVar2[0x10] = puVar2 + 0xe;
    puVar2[0x11] = puVar2 + 0xe;
    puVar2[0x12] = 0;
    puVar2[0x13] = 0;
    puVar2[0x14] = 0;
    puVar2[0x15] = 0;
    puVar2[0x16] = &PTR__ExceptionTranslatorRegistry_001b0550;
    puVar2[0x17] = 0;
    puVar2[0x18] = 0;
    puVar2[0x19] = 0;
  }
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (long *)0x0;
  if ((anonymous_namespace)::currentContext != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::currentContext + 8))();
  }
  (anonymous_namespace)::currentContext = (long *)0x0;
  return;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = CATCH_NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }